

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O0

CURLcode auth_digest_get_qop_values(char *options,int *value)

{
  int iVar1;
  undefined1 local_28 [8];
  Curl_str out;
  int *value_local;
  char *options_local;
  
  *value = 0;
  out.len = (size_t)value;
  value_local = (int *)options;
  do {
    iVar1 = Curl_str_until((char **)&value_local,(Curl_str *)local_28,0x20,',');
    if (iVar1 != 0) {
      return CURLE_OK;
    }
    iVar1 = Curl_str_casecompare((Curl_str *)local_28,"auth");
    if (iVar1 == 0) {
      iVar1 = Curl_str_casecompare((Curl_str *)local_28,"auth-int");
      if (iVar1 == 0) {
        iVar1 = Curl_str_casecompare((Curl_str *)local_28,"auth-conf");
        if (iVar1 != 0) {
          *(uint *)out.len = *(uint *)out.len | 4;
        }
      }
      else {
        *(uint *)out.len = *(uint *)out.len | 2;
      }
    }
    else {
      *(uint *)out.len = *(uint *)out.len | 1;
    }
    iVar1 = Curl_str_single((char **)&value_local,',');
  } while (iVar1 == 0);
  return CURLE_OK;
}

Assistant:

static CURLcode auth_digest_get_qop_values(const char *options, int *value)
{
  struct Curl_str out;
  /* Initialise the output */
  *value = 0;

  while(!Curl_str_until(&options, &out, 32, ',')) {
    if(Curl_str_casecompare(&out, DIGEST_QOP_VALUE_STRING_AUTH))
      *value |= DIGEST_QOP_VALUE_AUTH;
    else if(Curl_str_casecompare(&out, DIGEST_QOP_VALUE_STRING_AUTH_INT))
      *value |= DIGEST_QOP_VALUE_AUTH_INT;
    else if(Curl_str_casecompare(&out, DIGEST_QOP_VALUE_STRING_AUTH_CONF))
      *value |= DIGEST_QOP_VALUE_AUTH_CONF;
    if(Curl_str_single(&options, ','))
      break;
  }

  return CURLE_OK;
}